

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

int symbol_generate(lgx_ast_t *ast,lgx_ast_node_t *node)

{
  char cVar1;
  byte bVar2;
  lgx_ast_node_s **pplVar3;
  lgx_ast_node_t *plVar4;
  lgx_type_function_s *plVar5;
  int iVar6;
  lgx_ast_node_s *plVar7;
  lgx_symbol_t *plVar8;
  lgx_type_t *plVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  lgx_str_t local_40;
  
  cVar1 = *(char *)node;
  if (cVar1 == '\x18') {
    if (node->children != 5) {
      __assert_fail("node->children == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1ae,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    pplVar3 = node->child;
    if (*(char *)*pplVar3 != ',') {
      __assert_fail("node->child[0]->type == FUNCTION_RECEIVER",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1af,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[1] != '#') {
      __assert_fail("node->child[1]->type == IDENTIFIER_TOKEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b0,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[2] != '\x1b') {
      __assert_fail("node->child[2]->type == FUNCTION_DECL_PARAMETER",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b1,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[3] != '\"') {
      __assert_fail("node->child[3]->type == TYPE_EXPRESSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b2,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[4] != '\x01') {
      __assert_fail("node->child[4]->type == BLOCK_STATEMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b3,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    local_40.buffer = (ast->lex).source.content + pplVar3[1]->offset;
    local_40.length = pplVar3[1]->length;
    uVar11 = (ulong)local_40.length;
    local_40.size = 0;
    plVar7 = node->parent;
    if (*(char *)plVar7 != '\x01') {
      pcVar10 = "[invalid function declaration] %.*s\n";
      goto LAB_0011db89;
    }
    plVar8 = symbol_add(ast,node,(plVar7->u).symbols,S_CONSTANT,&local_40,
                        plVar7->parent == (lgx_ast_node_s *)0x0);
    if (plVar8 != (lgx_symbol_t *)0x0) {
      iVar6 = lgx_type_init(&plVar8->type,T_FUNCTION);
      if (iVar6 == 0) {
        plVar4 = *node->child;
        if (*(char *)plVar4 != ',') {
          __assert_fail("node->type == FUNCTION_RECEIVER",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x78,
                        "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                       );
        }
        uVar13 = plVar4->children;
        if (uVar13 != 0) {
          if (uVar13 != 1) {
            __assert_fail("node->children == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0x7e,
                          "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                         );
          }
          plVar7 = *plVar4->child;
          if (*(char *)plVar7 != '\x1b') {
            __assert_fail("node->child[0]->type == FUNCTION_DECL_PARAMETER",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0x7f,
                          "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                         );
          }
          if (plVar7->children == 1) {
            plVar7 = *plVar7->child;
            if (*(char *)plVar7 != '\x16') {
              __assert_fail("node->child[0]->child[0]->type == VARIABLE_DECLARATION",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0x86,
                            "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            if (plVar7->children != 2) {
              __assert_fail("node->child[0]->child[0]->children == 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0x87,
                            "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            if (*(char *)plVar7->child[1] != '\"') {
              __assert_fail("node->child[0]->child[0]->child[1]->type == TYPE_EXPRESSION",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                            ,0x88,
                            "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                           );
            }
            plVar9 = &((plVar8->type).u.arr)->value;
            iVar6 = symbol_parse_type(ast,plVar7->child[1],plVar9);
            uVar13 = 1;
            if ((iVar6 == 0) && (uVar13 = 0, plVar9->type != T_UNKNOWN)) {
              iVar6 = lgx_type_is_definite(plVar9);
              uVar13 = 0;
              if (iVar6 == 0) {
                pcVar10 = "receiver has incomplete type\n";
                goto LAB_0011dd5d;
              }
            }
          }
          else {
            pcVar10 = "there must be one and only one receiver of a method\n";
LAB_0011dd5d:
            symbol_error(ast,plVar4,pcVar10);
            uVar13 = 1;
          }
        }
        plVar4 = node->child[2];
        if (*(char *)plVar4 != '\x1b') {
          __assert_fail("node->type == FUNCTION_DECL_PARAMETER",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0xb4,
                        "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                       );
        }
        plVar5 = (plVar8->type).u.fun;
        uVar14 = plVar4->children;
        if ((ulong)uVar14 == 0) {
          plVar5->arg_len = 0;
LAB_0011de81:
          uVar14 = uVar13;
        }
        else {
          plVar9 = (lgx_type_t *)calloc((ulong)uVar14,0x20);
          plVar5->args = plVar9;
          if (plVar9 == (lgx_type_t *)0x0) {
            symbol_error(ast,plVar4,"out of memory\n");
            uVar14 = 1;
          }
          else {
            plVar5->arg_len = uVar14;
            lVar12 = 0;
            uVar11 = 0;
            bVar15 = false;
            do {
              plVar7 = plVar4->child[uVar11];
              if (*(char *)plVar7 != '\x16') {
                __assert_fail("node->child[i]->type == VARIABLE_DECLARATION",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                              ,0xc1,
                              "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                             );
              }
              if (plVar7->children != 2) {
                __assert_fail("node->child[i]->children == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                              ,0xc2,
                              "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                             );
              }
              if (*(char *)plVar7->child[1] != '\"') {
                __assert_fail("node->child[i]->child[1]->type == TYPE_EXPRESSION",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                              ,0xc3,
                              "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                             );
              }
              iVar6 = symbol_parse_type(ast,plVar7->child[1],
                                        (lgx_type_t *)((long)&plVar5->args->type + lVar12));
              if (iVar6 != 0) {
                bVar15 = true;
              }
              if ((*(int *)((long)&plVar5->args->type + lVar12) != 0) &&
                 (iVar6 = lgx_type_is_definite((lgx_type_t *)((long)&plVar5->args->type + lVar12)),
                 iVar6 == 0)) {
                symbol_error(ast,plVar4,"parameter has incomplete type\n");
                bVar15 = true;
              }
              uVar11 = uVar11 + 1;
              lVar12 = lVar12 + 0x20;
            } while (uVar11 < plVar4->children);
            uVar14 = 1;
            if (!bVar15) goto LAB_0011de81;
          }
        }
        iVar6 = symbol_parse_type_function_return
                          (ast,node->child[3],(lgx_type_function_t *)(plVar8->type).u.arr);
        if (iVar6 == 0) goto LAB_0011db9c;
      }
      else {
        pcVar10 = "out of memory\n";
LAB_0011db6a:
        symbol_error(ast,node,pcVar10);
      }
    }
  }
  else {
    uVar13 = 0;
    uVar14 = uVar13;
    if (cVar1 == '\x17') {
      if (node->children < 2) {
        __assert_fail("node->children >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x17b,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
      }
      plVar7 = *node->child;
      if (*(char *)plVar7 != '#') {
        __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x17c,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
      }
      if (*(char *)node->child[1] != '\"') {
        __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x17d,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
      }
      local_40.buffer = (ast->lex).source.content + plVar7->offset;
      local_40.length = plVar7->length;
      uVar11 = (ulong)local_40.length;
      local_40.size = 0;
      plVar7 = node->parent;
      if (*(char *)plVar7 == '\x01') {
        plVar8 = symbol_add(ast,node,(plVar7->u).symbols,S_CONSTANT,&local_40,
                            plVar7->parent == (lgx_ast_node_s *)0x0);
        if (plVar8 != (lgx_symbol_t *)0x0) {
          plVar9 = &plVar8->type;
          iVar6 = symbol_parse_type(ast,node->child[1],plVar9);
          if (iVar6 == 0) {
            if ((plVar9->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar9), iVar6 != 0))
            goto LAB_0011db9c;
            uVar11 = (ulong)local_40.length;
            pcVar10 = "constant %.*s has incomplete type\n";
            goto LAB_0011db89;
          }
        }
      }
      else {
        pcVar10 = "[invalid constant declaration] %.*s\n";
LAB_0011db89:
        symbol_error(ast,node,pcVar10,uVar11,local_40.buffer);
      }
    }
    else {
      uVar14 = 0;
      if (cVar1 != '\x16') goto LAB_0011db9c;
      if (node->children < 2) {
        __assert_fail("node->children >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x128,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      plVar7 = *node->child;
      if (*(char *)plVar7 != '#') {
        __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x129,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      if (*(char *)node->child[1] != '\"') {
        __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x12a,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      local_40.buffer = (ast->lex).source.content + plVar7->offset;
      local_40.length = plVar7->length;
      uVar11 = (ulong)local_40.length;
      local_40.size = 0;
      plVar7 = node->parent;
      bVar2 = *(byte *)plVar7;
      if (bVar2 < 0x1b) {
        if (bVar2 != 1) {
          if (bVar2 == 4) goto LAB_0011db96;
LAB_0011db82:
          pcVar10 = "[invalid variable declaration] %.*s\n";
          goto LAB_0011db89;
        }
        bVar15 = plVar7->parent == (lgx_ast_node_s *)0x0;
      }
      else {
        if (bVar2 == 0x1b) {
          plVar7 = plVar7->parent;
          if ((plVar7 == (lgx_ast_node_s *)0x0) || (*(char *)plVar7 != '\x18')) {
            __assert_fail("node->parent->parent && node->parent->parent->type == FUNCTION_DECLARATION"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0x14f,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
          }
          plVar7 = plVar7->child[4];
        }
        else {
          if (bVar2 != 0x1c) goto LAB_0011db82;
          if (*plVar7->child != node) {
            pcVar10 = "too many paramters\n";
            goto LAB_0011db6a;
          }
          plVar7 = plVar7->parent;
          if ((plVar7 == (lgx_ast_node_s *)0x0) || (*(char *)plVar7 != '\x0f')) {
            __assert_fail("node->parent->parent && node->parent->parent->type == CATCH_STATEMENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0x15c,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
          }
          plVar7 = plVar7->child[1];
        }
        bVar15 = false;
      }
      plVar8 = symbol_add(ast,node,(plVar7->u).symbols,S_VARIABLE,&local_40,bVar15);
      if (plVar8 != (lgx_symbol_t *)0x0) {
        plVar9 = &plVar8->type;
        iVar6 = symbol_parse_type(ast,node->child[1],plVar9);
        if (iVar6 == 0) {
          uVar14 = uVar13;
          if ((plVar9->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar9), iVar6 != 0))
          goto LAB_0011db9c;
          uVar11 = (ulong)local_40.length;
          pcVar10 = "variable %.*s has incomplete type\n";
          goto LAB_0011db89;
        }
      }
    }
  }
LAB_0011db96:
  uVar14 = 1;
LAB_0011db9c:
  if (node->children != 0) {
    uVar11 = 0;
    do {
      iVar6 = symbol_generate(ast,node->child[uVar11]);
      if (iVar6 != 0) {
        uVar14 = 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < node->children);
  }
  return uVar14;
}

Assistant:

static int symbol_generate(lgx_ast_t* ast, lgx_ast_node_t* node) {
    int i, ret = 0;

    switch (node->type) {
        case PACKAGE_DECLARATION:
            break;
        case IMPORT_DECLARATION:
            break;
        case EXPORT_DECLARATION:
            break;
        case VARIABLE_DECLARATION:
            if (symbol_add_variable(ast, node)) {
                ret = 1;
            }
            break;
        case CONSTANT_DECLARATION:
            if (symbol_add_constant(ast, node)) {
                ret = 1;
            }
            break;
        case FUNCTION_DECLARATION:
            if (symbol_add_function(ast, node)) {
                ret = 1;
            }
            break;
        case TYPE_DECLARATION:
            break;
        default: break;
    }

    for (i = 0; i < node->children; ++i) {
        if (symbol_generate(ast, node->child[i])) {
            ret = 1;
        }
    }
    
    return ret;
}